

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_issueIdWithModelThatWasDeleted_Test::~Annotator_issueIdWithModelThatWasDeleted_Test
          (Annotator_issueIdWithModelThatWasDeleted_Test *this)

{
  Annotator_issueIdWithModelThatWasDeleted_Test *this_local;
  
  ~Annotator_issueIdWithModelThatWasDeleted_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Annotator, issueIdWithModelThatWasDeleted)
{
    libcellml::ModelPtr model;
    auto parser = libcellml::Parser::create();
    model = parser->parseModel(modelStringUniqueIds);
    auto annotator = libcellml::Annotator::create();

    annotator->setModel(model);

    auto component = model->component(0);
    EXPECT_EQ("component_1", component->id());

    EXPECT_TRUE(annotator->hasModel());
    model.reset();
    EXPECT_FALSE(annotator->hasModel());

    EXPECT_EQ("", annotator->assignId(component));
    EXPECT_EQ("component_1", component->id());
}